

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraph::PerspectiveCameraNode::print
          (PerspectiveCameraNode *this,ostream *cout,int depth)

{
  int iVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(cout,"PerspectiveCameraNode @ ",0x18);
  poVar2 = std::ostream::_M_insert<void_const*>(cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," { ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iVar1 = std::__cxx11::string::compare((char *)&(this->super_Node).name);
  if (iVar1 != 0) {
    if (-1 < depth) {
      iVar1 = depth + 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(cout,"name = ",7);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (cout,(this->super_Node).name._M_dataplus._M_p,
                        (this->super_Node).name._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if (-1 < depth) {
    iVar1 = depth + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"from = ",7);
  std::__ostream_insert<char,std::char_traits<char>>(cout,"(",1);
  poVar2 = std::ostream::_M_insert<double>((double)(this->data).from.field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)(this->data).from.field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)(this->data).from.field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (-1 < depth) {
    iVar1 = depth + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"to   = ",7);
  std::__ostream_insert<char,std::char_traits<char>>(cout,"(",1);
  poVar2 = std::ostream::_M_insert<double>((double)(this->data).to.field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)(this->data).to.field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)(this->data).to.field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (-1 < depth) {
    iVar1 = depth + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"up   = ",7);
  std::__ostream_insert<char,std::char_traits<char>>(cout,"(",1);
  poVar2 = std::ostream::_M_insert<double>((double)(this->data).up.field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)(this->data).up.field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)(this->data).up.field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (-1 < depth) {
    iVar1 = depth + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"fov  = ",7);
  poVar2 = std::ostream::_M_insert<double>((double)(this->data).fov);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (0 < depth) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(cout,"  ",2);
      depth = depth + -1;
    } while (depth != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cout,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)cout + -0x18) + (char)cout);
  std::ostream::put((char)cout);
  std::ostream::flush();
  return;
}

Assistant:

void SceneGraph::PerspectiveCameraNode::print(std::ostream& cout, int depth) {
    cout << "PerspectiveCameraNode @ " << this << " { " << std::endl;
    if (name != "") {
      tab(cout, depth+1); cout << "name = " << name << std::endl;
    }
    tab(cout, depth+1); cout << "from = " << data.from << std::endl;
    tab(cout, depth+1); cout << "to   = " << data.to   << std::endl;
    tab(cout, depth+1); cout << "up   = " << data.up   << std::endl;
    tab(cout, depth+1); cout << "fov  = " << data.fov  << std::endl;
    tab(cout, depth); cout << "}" << std::endl;
  }